

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O1

boolean encode_mcu_AC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_encoder *pjVar2;
  JBLOCKROW paJVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  jpeg_entropy_encoder *pjVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  int *piVar15;
  _func_void_j_compress_ptr *p_Var16;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)&pjVar2[4].start_pass == 0) {
      emit_restart(cinfo,*(int *)((long)&pjVar2[4].start_pass + 4));
      *(uint *)&pjVar2[4].start_pass = cinfo->restart_interval;
      *(uint *)((long)&pjVar2[4].start_pass + 4) =
           *(int *)((long)&pjVar2[4].start_pass + 4) + 1U & 7;
    }
    *(int *)&pjVar2[4].start_pass = *(int *)&pjVar2[4].start_pass + -1;
  }
  paJVar3 = *MCU_data;
  uVar11 = (ulong)cinfo->Se;
  if (0 < (long)uVar11) {
    do {
      uVar6 = (uint)(*paJVar3)[jpeg_natural_order[uVar11]];
      if ((*paJVar3)[jpeg_natural_order[uVar11]] < 0) {
        uVar6 = -uVar6;
      }
      if (uVar6 >> ((byte)cinfo->Al & 0x1f) != 0) goto LAB_00111751;
      bVar4 = 1 < (long)uVar11;
      uVar11 = uVar11 - 1;
    } while (bVar4);
    uVar11 = 0;
  }
LAB_00111751:
  iVar10 = (int)uVar11;
  uVar12 = uVar11 & 0xffffffff;
  if (0 < iVar10) {
    uVar12 = uVar11 & 0xffffffff;
    do {
      uVar6 = (uint)(*paJVar3)[jpeg_natural_order[uVar12]];
      if ((*paJVar3)[jpeg_natural_order[uVar12]] < 0) {
        uVar6 = -uVar6;
      }
      if (uVar6 >> ((byte)cinfo->Ah & 0x1f) != 0) goto LAB_00111795;
      bVar4 = 1 < (long)uVar12;
      uVar12 = uVar12 - 1;
    } while (bVar4);
    uVar12 = 0;
  }
LAB_00111795:
  iVar1 = cinfo->cur_comp_info[0]->ac_tbl_no;
  iVar8 = cinfo->Ss;
  if (iVar8 <= iVar10) {
LAB_001117c6:
    p_Var16 = (&pjVar2[9].finish_pass)[iVar1];
    lVar14 = (long)(iVar8 * 3 + -3);
    if ((int)uVar12 < iVar8) {
      arith_encode(cinfo,(uchar *)(p_Var16 + lVar14),0);
    }
    piVar15 = jpeg_natural_order + iVar8;
    p_Var16 = p_Var16 + lVar14 + 1;
    iVar13 = iVar8;
    do {
      uVar6 = (uint)(*paJVar3)[*piVar15];
      pjVar9 = pjVar2 + 0xf;
      if ((*paJVar3)[*piVar15] < 0) {
        uVar7 = -uVar6 >> ((byte)cinfo->Al & 0x1f);
        if ((short)uVar7 != 0) {
          if ((uVar7 & 0xffff) != 1) goto LAB_00111890;
          arith_encode(cinfo,(uchar *)p_Var16,1);
          uVar7 = 1;
          goto LAB_0011189c;
        }
      }
      else {
        bVar5 = (byte)cinfo->Al & 0x1f;
        uVar7 = uVar6 >> bVar5;
        if (uVar6 >> bVar5 != 0) goto LAB_00111848;
      }
      arith_encode(cinfo,(uchar *)p_Var16,0);
      iVar13 = iVar13 + 1;
      piVar15 = piVar15 + 1;
      p_Var16 = p_Var16 + 3;
    } while( true );
  }
LAB_001118c3:
  if (iVar8 <= cinfo->Se) {
    arith_encode(cinfo,(uchar *)((&pjVar2[9].finish_pass)[iVar1] + (iVar8 * 3 + -3)),1);
  }
  return 1;
LAB_00111848:
  if (uVar7 == 1) {
    arith_encode(cinfo,(uchar *)p_Var16,1);
    uVar7 = 0;
  }
  else {
LAB_00111890:
    uVar7 = uVar7 & 1;
    pjVar9 = (jpeg_entropy_encoder *)(p_Var16 + 1);
  }
LAB_0011189c:
  arith_encode(cinfo,(uchar *)pjVar9,uVar7);
  iVar8 = iVar13 + 1;
  if (iVar10 <= iVar13) goto code_r0x001118bd;
  goto LAB_001117c6;
code_r0x001118bd:
  iVar8 = iVar13 + 1;
  goto LAB_001118c3;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_refine(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  register int temp, r, idx;
  char *BR_buffer;
  unsigned int BR;
  int Sl = cinfo->Se - cinfo->Ss + 1;
  int Al = cinfo->Al;
  JCOEF absvalues_unaligned[DCTSIZE2 + 15];
  JCOEF *absvalues;
  const JCOEF *cabsvalue, *EOBPTR;
  size_t zerobits, signbits;
  size_t bits[16 / SIZEOF_SIZE_T];

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart(entropy, entropy->next_restart_num);

#ifdef WITH_SIMD
  cabsvalue = absvalues = (JCOEF *)PAD((JUINTPTR)absvalues_unaligned, 16);
#else
  /* Not using SIMD, so alignment is not needed */
  cabsvalue = absvalues = absvalues_unaligned;
#endif

  /* Prepare data */
  EOBPTR = absvalues +
    entropy->AC_refine_prepare(MCU_data[0][0], jpeg_natural_order + cinfo->Ss,
                               Sl, Al, absvalues, bits);

  /* Encode the AC coefficients per section G.1.2.3, fig. G.7 */

  r = 0;                        /* r = run length of zeros */
  BR = 0;                       /* BR = count of buffered bits added now */
  BR_buffer = entropy->bit_buffer + entropy->BE; /* Append bits to buffer */

  zerobits = bits[0];
#if SIZEOF_SIZE_T == 8
  signbits = bits[1];
#else
  signbits = bits[2];
#endif
  ENCODE_COEFS_AC_REFINE((void)0;);

#if SIZEOF_SIZE_T == 4
  zerobits = bits[1];
  signbits = bits[3];

  if (zerobits) {
    int diff = ((absvalues + DCTSIZE2 / 2) - cabsvalue);
    idx = count_zeroes(&zerobits);
    signbits >>= idx;
    idx += diff;
    r += idx;
    cabsvalue += idx;
    goto first_iter_ac_refine;
  }

  ENCODE_COEFS_AC_REFINE(first_iter_ac_refine:);
#endif

  r |= (int)((absvalues + Sl) - cabsvalue);

  if (r > 0 || BR > 0) {        /* If there are trailing zeroes, */
    entropy->EOBRUN++;          /* count an EOB */
    entropy->BE += BR;          /* concat my correction bits to older ones */
    /* We force out the EOB if we risk either:
     * 1. overflow of the EOB counter;
     * 2. overflow of the correction bit buffer during the next MCU.
     */
    if (entropy->EOBRUN == 0x7FFF ||
        entropy->BE > (MAX_CORR_BITS - DCTSIZE2 + 1))
      emit_eobrun(entropy);
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}